

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void main_loop(tgestate_t *state)

{
  (*state->speccy->stamp)(state->speccy);
  if (state->morale < 2) {
    queue_message(state,message_MORALE_IS_ZERO);
    state->morale_exhausted = 0xff;
    state->automatic_player_counter = '\0';
  }
  keyscan_break(state);
  message_display(state);
  process_player_input(state);
  in_permitted_area(state);
  restore_tiles(state);
  move_a_character(state);
  automatics(state);
  purge_invisible_characters(state);
  spawn_characters(state);
  mark_nearby_items(state);
  ring_bell(state);
  animate(state);
  move_map(state);
  message_display(state);
  ring_bell(state);
  plot_sprites(state);
  plot_game_window(state);
  ring_bell(state);
  if (state->day_or_night != '\0') {
    nighttime(state);
  }
  wave_morale_flag(state);
  if ((state->game_counter & 0x3f) == 0) {
    dispatch_timed_event(state);
  }
  (*state->speccy->sleep)(state->speccy,0x59c73);
  return;
}

Assistant:

void main_loop(tgestate_t *state)
{
  assert(state != NULL);

  state->speccy->stamp(state->speccy);

  check_morale(state);
  keyscan_break(state);
  message_display(state);
  process_player_input(state);
  in_permitted_area(state);
  restore_tiles(state);
  move_a_character(state);
  automatics(state);
  purge_invisible_characters(state);
  spawn_characters(state);
  mark_nearby_items(state);
  ring_bell(state);
  animate(state);
  move_map(state);
  message_display(state); /* second */
  ring_bell(state); /* second */
  plot_sprites(state);
  plot_game_window(state);
  ring_bell(state); /* third */
  if (state->day_or_night != 0)
    nighttime(state);
  /* Conv: Removed interior_delay_loop call here. */
  wave_morale_flag(state);
  if ((state->game_counter & 63) == 0)
    dispatch_timed_event(state);

  /* Conv: Timing: To calculate the magic timing interval value here the
   * original game was run in FUSE and its main_loop breakpointed. For both
   * indoor and outdoor scenes the T-states and current frame number were
   * captured, then the average T-state figure for the game was calculated.
   *
   * The original game is not dependent on accurate timing: it is much slower
   * in outdoor scenes and especially when multiple characters are on the
   * screen simultaneously. */
  (void) state->speccy->sleep(state->speccy, 367731);
}